

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

bool __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseMatch<0ul,kj::StringPtr&>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,char (*params) [7])

{
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> local_28 [8];
  size_t local_20;
  
  table.size_ = *(size_t *)this;
  table.ptr = (StringPtr *)(this + 0x20);
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
            (local_28,table,(char (*) [7])((long)(*(long *)(this + 8) - *(size_t *)this) >> 5));
  if (local_28[0] != (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0) {
    Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
    ::eraseImpl((Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
                 *)this,local_20);
  }
  return (bool)local_28[0];
}

Assistant:

bool Table<Row, Indexes...>::eraseMatch(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    eraseImpl(pos);
    return true;
  } else {
    return false;
  }
}